

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

uint32 __thiscall
Js::ByteCodeBufferBuilder::GetDebuggerScopeSlotArrayCount
          (ByteCodeBufferBuilder *this,FunctionBody *function)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  ScopeObjectChain *pSVar5;
  
  if (function == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x6c4,"(function)","function");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pSVar5 = FunctionBody::GetScopeObjectChain(function);
  if (pSVar5 != (ScopeObjectChain *)0x0) {
    pSVar5 = FunctionBody::GetScopeObjectChain(function);
    uVar3 = JsUtil::ReadOnlyList<Js::DebuggerScope*,Memory::Recycler,DefaultComparer>::
            CountWhere<Js::ByteCodeBufferBuilder::GetDebuggerScopeSlotArrayCount(Js::FunctionBody*)::_lambda(Js::DebuggerScope*)_1_>
                      ((ReadOnlyList<Js::DebuggerScope*,Memory::Recycler,DefaultComparer> *)
                       (pSVar5->pScopeChain).ptr);
    return uVar3;
  }
  return 0;
}

Assistant:

uint32 GetDebuggerScopeSlotArrayCount(FunctionBody * function)
    {
        Assert(function);
        uint debuggerScopeSlotArraySize = 0;
        if (function->GetScopeObjectChain())
        {
            debuggerScopeSlotArraySize = function->GetScopeObjectChain()->pScopeChain->CountWhere([&](DebuggerScope* scope)
            {
                return scope->IsSlotScope();
            });
        }

        return debuggerScopeSlotArraySize;
    }